

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFlattenTo2DLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  FlattenTo2DLayerParams *this_00;
  Tensor *this_01;
  int64 iVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string err;
  int rank;
  FlattenTo2DLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      this_00 = Specification::NeuralNetworkLayer::flattento2d(layer);
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
      if (0 < iVar2) {
        this_01 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
        err.field_2._12_4_ = Specification::Tensor::rank(this_01);
        iVar3 = Specification::FlattenTo2DLayerParams::axis(this_00);
        if ((iVar3 < (int)-err.field_2._12_4_) ||
           (iVar3 = Specification::FlattenTo2DLayerParams::axis(this_00),
           (int)err.field_2._12_4_ <= iVar3)) {
          __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::operator+(&local_90,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         __rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,&local_90,"\' layer.");
          std::__cxx11::string::~string((string *)&local_90);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
          std::__cxx11::string::~string((string *)local_70);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFlattenTo2DLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.flattento2d();
    // axis should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}